

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

int Bac_ManAssignInternTwo(Bac_Ntk_t *p,int iNum,int nDigits,char *pPref,Vec_Int_t *vMap)

{
  int iVar1;
  bool bVar2;
  int local_40;
  uint local_3c;
  int NameId;
  int i;
  char Buffer [16];
  Vec_Int_t *vMap_local;
  char *pPref_local;
  int nDigits_local;
  int iNum_local;
  Bac_Ntk_t *p_local;
  
  local_40 = 0;
  local_3c = 0;
  Buffer._8_8_ = vMap;
  while( true ) {
    bVar2 = true;
    if (local_40 != 0) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)Buffer._8_8_,local_40);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    if (local_3c == 0) {
      sprintf((char *)&NameId,"%s%0*d",pPref,(ulong)(uint)nDigits,(ulong)(uint)iNum);
    }
    else {
      sprintf((char *)&NameId,"%s%0*d_%d",pPref,(ulong)(uint)nDigits,(ulong)(uint)iNum,
              (ulong)local_3c);
    }
    local_40 = Abc_NamStrFindOrAdd(p->pDesign->pStrs,(char *)&NameId,(int *)0x0);
    local_3c = local_3c + 1;
  }
  Vec_IntWriteEntry((Vec_Int_t *)Buffer._8_8_,local_40,1);
  return local_40;
}

Assistant:

int Bac_ManAssignInternTwo( Bac_Ntk_t * p, int iNum, int nDigits, char * pPref, Vec_Int_t * vMap )
{
    char Buffer[16]; int i, NameId = 0;
    for ( i = 0; !NameId || Vec_IntEntry(vMap, NameId); i++ )
    {
        if ( i == 0 )
            sprintf( Buffer, "%s%0*d", pPref, nDigits, iNum );
        else
            sprintf( Buffer, "%s%0*d_%d", pPref, nDigits, iNum, i );
        NameId = Abc_NamStrFindOrAdd( p->pDesign->pStrs, Buffer, NULL );
    }
    Vec_IntWriteEntry( vMap, NameId, 1 );
    return NameId;
}